

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O3

bool __thiscall
cmUuid::StringToBinary
          (cmUuid *this,string *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  int iVar1;
  pointer puVar2;
  bool bVar3;
  array<int,_5UL> *paVar4;
  string *this_00;
  long lVar5;
  long lVar6;
  string local_50;
  
  puVar2 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(output,0x10);
  if (input->_M_string_length == 0x24) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      if (lVar6 == 0) {
        paVar4 = &kUuidGroups;
      }
      else {
        if ((input->_M_dataplus)._M_p[lVar5] != '-') goto LAB_00339635;
        lVar5 = lVar5 + 1;
        paVar4 = (array<int,_5UL> *)((long)kUuidGroups._M_elems + lVar6);
      }
      iVar1 = paVar4->_M_elems[0];
      this_00 = &local_50;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
      bVar3 = StringToBinaryImpl((cmUuid *)this_00,&local_50,output);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) goto LAB_00339635;
      lVar5 = lVar5 + (long)iVar1 * 2;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x14);
    bVar3 = true;
  }
  else {
LAB_00339635:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmUuid::StringToBinary(std::string const& input,
                            std::vector<unsigned char>& output) const
{
  output.clear();
  output.reserve(16);

  if (input.length() != 36) {
    return false;
  }
  size_t index = 0;
  for (size_t i = 0; i < kUuidGroups.size(); ++i) {
    if (i != 0 && input[index++] != '-') {
      return false;
    }
    size_t digits = kUuidGroups[i] * 2;
    if (!StringToBinaryImpl(input.substr(index, digits), output)) {
      return false;
    }

    index += digits;
  }

  return true;
}